

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O3

void cmDyndepCollation::AddCollationInformation
               (Value *tdi,cmGeneratorTarget *gt,string *config,cmDyndepGeneratorCallbacks *cb)

{
  _Base_ptr *pp_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
  **ppmVar2;
  Comments *pCVar3;
  cmTarget *pcVar4;
  pointer pcVar5;
  pointer puVar6;
  cmInstallGenerator *pcVar7;
  _Base_ptr p_Var8;
  cmGeneratorTarget *pcVar9;
  cmMakefile *pcVar10;
  cmInstallExportGenerator *this;
  pointer puVar11;
  cmExportBuildFileGenerator *pcVar12;
  pointer ppcVar13;
  pointer pTVar14;
  pointer puVar15;
  int iVar16;
  uint uVar17;
  cmFileSet *this_00;
  cmInstallFileSetGenerator *this_01;
  iterator iVar18;
  Value *pVVar19;
  Value *pVVar20;
  _Base_ptr p_Var21;
  cmInstallCxxModuleBmiGenerator *this_02;
  cmGlobalGenerator *pcVar22;
  _Rb_tree_header *p_Var23;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *pvVar24;
  string *psVar25;
  _Rb_tree_node_base *__k;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  pointer puVar28;
  cmInstallCxxModuleBmiGenerator *pcVar29;
  pointer pTVar30;
  pointer name;
  pointer_____offset_0x10___ *__x;
  undefined8 uVar31;
  char *value;
  long lVar32;
  _Alloc_hider _Var33;
  ulong uVar34;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *cge;
  pointer ppcVar35;
  pointer puVar36;
  pointer pTVar37;
  pointer pTVar38;
  pointer pTVar39;
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *ig;
  ValueHolder VVar40;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  static_string_view sVar41;
  string fs_type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files_per_dirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> obj_path;
  Value fs_dest;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> cxxModuleSources;
  anon_class_24_3_20354611 fill_sf_map;
  string dest;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
  sf_map;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_file_sets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  
  pcVar4 = gt->Target;
  cmTarget::GetAllFileSetNames_abi_cxx11_(&all_file_sets,pcVar4);
  Json::Value::Value((Value *)&dest,objectValue);
  if (all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      all_file_sets.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    name = all_file_sets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = cmTarget::GetFileSet(pcVar4,name);
      if (this_00 == (cmFileSet *)0x0) {
        pcVar10 = gt->Makefile;
        cmTarget::GetName_abi_cxx11_(pcVar4);
        fill_sf_map.gt = (cmGeneratorTarget *)0x8;
        fill_sf_map.tgt = (cmTarget *)0x819c37;
        fill_sf_map.sf_map =
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
              *)0x0;
        views._M_len = 5;
        views._M_array = (iterator)&fill_sf_map;
        cmCatViews((string *)&files_per_dirs,views);
        cmMakefile::IssueMessage(pcVar10,INTERNAL_ERROR,(string *)&files_per_dirs);
        uVar31 = files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        _Var33._M_p = (pointer)files_per_dirs._M_t._M_impl._0_8_;
        if ((_Base_ptr *)files_per_dirs._M_t._M_impl._0_8_ !=
            &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
        goto LAB_004818d4;
      }
      else {
        fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
        pcVar5 = (this_00->Type)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&fs_type,pcVar5,pcVar5 + (this_00->Type)._M_string_length);
        if ((fs_type._M_string_length == 0xb) &&
           (*(long *)(fs_type._M_dataplus._M_p + 3) == 0x53454c55444f4d5f &&
            *(long *)fs_type._M_dataplus._M_p == 0x55444f4d5f585843)) {
          cmFileSet::CompileFileEntries(&fileEntries,this_00);
          cmFileSet::CompileDirectoryEntries(&directoryEntries,this_00);
          cmFileSet::EvaluateDirectoryEntries
                    (&directories,this_00,&directoryEntries,gt->LocalGenerator,config,gt,
                     (cmGeneratorExpressionDAGChecker *)0x0);
          puVar15 = fileEntries.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          for (cge = fileEntries.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; cge != puVar15; cge = cge + 1) {
            cmFileSet::EvaluateFileEntry
                      (this_00,&directories,&files_per_dirs,cge,gt->LocalGenerator,config,gt,
                       (cmGeneratorExpressionDAGChecker *)0x0);
          }
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &sf_map._M_t._M_impl.super__Rb_tree_header._M_header;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          fill_sf_map.sf_map = &sf_map;
          fs_dest.comments_.ptr_._M_t.
          super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
          .
          super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
          ._M_head_impl =
               (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
                  )0x0;
          fs_dest.value_.int_ = 0;
          fs_dest.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
          fs_dest._12_4_ = 0;
          fill_sf_map.gt = gt;
          fill_sf_map.tgt = pcVar4;
          sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cmGeneratorTarget::GetObjectSources
                    (gt,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &fs_dest,config);
          uVar31 = fs_dest._8_8_;
          for (VVar40 = fs_dest.value_; VVar40.int_ != uVar31;
              VVar40.string_ = (char *)&((VVar40.map_)->_M_t)._M_impl.super__Rb_tree_header) {
            anon_unknown.dwarf_1b7d474::CollationInformationCxxModules::anon_class_24_3_20354611::
            operator()(&fill_sf_map,*(cmSourceFile **)VVar40.string_,ObjectAndBmi);
          }
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmGeneratorTarget::GetCxxModuleSources(gt,&cxxModuleSources,config);
          ppcVar13 = cxxModuleSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppcVar35 = cxxModuleSources.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppcVar35 != ppcVar13;
              ppcVar35 = ppcVar35 + 1) {
            anon_unknown.dwarf_1b7d474::CollationInformationCxxModules::anon_class_24_3_20354611::
            operator()(&fill_sf_map,*ppcVar35,BmiOnly);
          }
          if (cxxModuleSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(cxxModuleSources.
                            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)cxxModuleSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)cxxModuleSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (fs_dest.value_.int_ != 0) {
            operator_delete(fs_dest.value_.string_,
                            (long)fs_dest.comments_.ptr_._M_t.
                                  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                  .
                                  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                  ._M_head_impl - (long)fs_dest.value_);
          }
          __x = (pointer_____offset_0x10___ *)0x0;
          Json::Value::Value(&fs_dest,nullValue);
          puVar6 = (gt->Makefile->InstallGenerators).
                   super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar36 = (gt->Makefile->InstallGenerators).
                         super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar6;
              puVar36 = puVar36 + 1) {
            pcVar7 = (puVar36->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
            if (pcVar7 != (cmInstallGenerator *)0x0) {
              __x = &cmInstallGenerator::typeinfo;
              this_01 = (cmInstallFileSetGenerator *)
                        __dynamic_cast(pcVar7,&cmInstallGenerator::typeinfo,
                                       &cmInstallFileSetGenerator::typeinfo,0);
              if (((this_01 != (cmInstallFileSetGenerator *)0x0) && (this_01->Target == gt)) &&
                 (this_01->FileSet == this_00)) {
                cmInstallFileSetGenerator::GetDestination
                          ((string *)&cxxModuleSources,this_01,config);
                Json::Value::Value((Value *)&fill_sf_map,(string *)&cxxModuleSources);
                __x = (pointer_____offset_0x10___ *)&fill_sf_map;
                Json::Value::operator=(&fs_dest,(Value *)&fill_sf_map);
                Json::Value::~Value((Value *)&fill_sf_map);
                if (cxxModuleSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    (pointer)&cxxModuleSources.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  __x = (pointer_____offset_0x10___ *)
                        ((long)cxxModuleSources.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                  operator_delete(cxxModuleSources.
                                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
                }
              }
            }
          }
          if ((_Rb_tree_header *)files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              != &files_per_dirs._M_t._M_impl.super__Rb_tree_header) {
            p_Var21 = files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            do {
              p_Var27 = *(_Base_ptr *)&p_Var21[2]._M_color;
              p_Var8 = p_Var21[2]._M_parent;
              if (p_Var27 != p_Var8) {
                __k = p_Var21;
                do {
                  cmsys::SystemTools::CollapseFullPath
                            ((string *)&cxxModuleSources,(string *)p_Var27);
                  p_Var23 = &sf_map._M_t._M_impl.super__Rb_tree_header;
                  iVar18 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                           ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                                             *)sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent,(_Link_type)p_Var23,
                                            (_Base_ptr)&cxxModuleSources,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)__k);
                  if (((_Rb_tree_header *)iVar18._M_node == p_Var23) ||
                     (iVar16 = std::__cxx11::string::compare((string *)&cxxModuleSources),
                     iVar16 < 0)) {
                    pcVar10 = gt->Makefile;
                    cmTarget::GetName_abi_cxx11_(pcVar4);
                    fill_sf_map.gt = (cmGeneratorTarget *)0x8;
                    fill_sf_map.tgt = (cmTarget *)0x819c37;
                    fill_sf_map.sf_map =
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                          *)0x0;
                    __k = p_Var27->_M_parent;
                    views_00._M_len = 5;
                    views_00._M_array = (iterator)&fill_sf_map;
                    cmCatViews(&obj_path,views_00);
                    __x = (pointer_____offset_0x10___ *)0x2;
                    cmMakefile::IssueMessage(pcVar10,FATAL_ERROR,&obj_path);
                  }
                  else {
                    pcVar9 = *(cmGeneratorTarget **)(iVar18._M_node + 2);
                    if (pcVar9 == (cmGeneratorTarget *)0x0) {
                      pcVar10 = gt->Makefile;
                      cmTarget::GetName_abi_cxx11_(pcVar4);
                      fill_sf_map.gt = (cmGeneratorTarget *)0x8;
                      fill_sf_map.tgt = (cmTarget *)0x819c37;
                      fill_sf_map.sf_map =
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                            *)0x0;
                      __k = p_Var27->_M_parent;
                      views_01._M_len = 5;
                      views_01._M_array = (iterator)&fill_sf_map;
                      cmCatViews(&obj_path,views_01);
                      __x = (pointer_____offset_0x10___ *)0x3;
                      cmMakefile::IssueMessage(pcVar10,INTERNAL_ERROR,&obj_path);
                    }
                    else {
                      iVar16 = *(int *)&iVar18._M_node[2]._M_parent;
                      fill_sf_map.gt = pcVar9;
                      if (iVar16 == 0) {
                        if ((cb->ObjectFilePath).super__Function_base._M_manager ==
                            (_Manager_type)0x0) goto LAB_0048263c;
                        (*(cb->ObjectFilePath)._M_invoker)
                                  (&obj_path,(_Any_data *)cb,(cmSourceFile **)&fill_sf_map,config);
                      }
                      else {
                        if ((cb->BmiFilePath).super__Function_base._M_manager == (_Manager_type)0x0)
                        {
LAB_0048263c:
                          std::__throw_bad_function_call();
                        }
                        (*(cb->BmiFilePath)._M_invoker)
                                  (&obj_path,(_Any_data *)&cb->BmiFilePath,
                                   (cmSourceFile **)&fill_sf_map,config);
                      }
                      Json::Value::Value((Value *)&fill_sf_map,objectValue);
                      pVVar19 = Json::Value::operator[]((Value *)&dest,&obj_path);
                      pVVar19 = Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)&cxxModuleSources);
                      pVVar20 = Json::Value::operator[](pVVar19,"source");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,iVar16 == 1);
                      pVVar20 = Json::Value::operator[](pVVar19,"bmi-only");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)(p_Var21 + 1));
                      pVVar20 = Json::Value::operator[](pVVar19,"relative-directory");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,&this_00->Name);
                      pVVar20 = Json::Value::operator[](pVVar19,"name");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      Json::Value::Value((Value *)&fill_sf_map,&this_00->Type);
                      pVVar20 = Json::Value::operator[](pVVar19,"type");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      sVar41 = cmFileSetVisibilityToName(this_00->Visibility);
                      __k = (_Rb_tree_node_base *)
                            &targets.
                             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      targets.
                      super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)__k;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&targets,sVar41.super_string_view._M_str,
                                 sVar41.super_string_view._M_str + sVar41.super_string_view._M_len);
                      Json::Value::Value((Value *)&fill_sf_map,(String *)&targets);
                      pVVar20 = Json::Value::operator[](pVVar19,"visibility");
                      Json::Value::operator=(pVVar20,(Value *)&fill_sf_map);
                      Json::Value::~Value((Value *)&fill_sf_map);
                      if (targets.
                          super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&targets.
                                    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(targets.
                                        super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((targets.
                                                  super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->Name)._M_dataplus._M_p + 1));
                      }
                      pVVar19 = Json::Value::operator[](pVVar19,"destination");
                      __x = (pointer_____offset_0x10___ *)&fs_dest;
                      Json::Value::operator=(pVVar19,(Value *)__x);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)obj_path._M_dataplus._M_p != &obj_path.field_2) {
                    __x = (pointer_____offset_0x10___ *)(obj_path.field_2._M_allocated_capacity + 1)
                    ;
                    operator_delete(obj_path._M_dataplus._M_p,(ulong)__x);
                  }
                  if (cxxModuleSources.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&cxxModuleSources.
                                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    __x = (pointer_____offset_0x10___ *)
                          ((long)cxxModuleSources.
                                 super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
                    operator_delete(cxxModuleSources.
                                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
                  }
                  p_Var27 = p_Var27 + 1;
                } while (p_Var27 != p_Var8);
              }
              p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
            } while ((_Rb_tree_header *)p_Var21 !=
                     &files_per_dirs._M_t._M_impl.super__Rb_tree_header);
          }
          Json::Value::~Value(&fs_dest);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_cmSourceFile_*,_CompileType>_>_>_>
                      *)sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__x);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&files_per_dirs._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&directories);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&directoryEntries);
          std::
          vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
          ::~vector(&fileEntries);
        }
        uVar31 = fs_type.field_2._M_allocated_capacity;
        _Var33._M_p = fs_type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
LAB_004818d4:
          operator_delete(_Var33._M_p,(ulong)((long)&((_Base_ptr)uVar31)->_M_color + 1));
        }
      }
      name = name + 1;
    } while (name != all_file_sets.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_file_sets);
  pVVar19 = Json::Value::operator[](tdi,"cxx-modules");
  Json::Value::operator=(pVVar19,(Value *)&dest);
  Json::Value::~Value((Value *)&dest);
  puVar36 = (gt->Makefile->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (gt->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar36 != puVar6) {
    pcVar29 = (cmInstallCxxModuleBmiGenerator *)0x0;
    do {
      pcVar7 = (puVar36->_M_t).
               super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
               .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
      if (((pcVar7 == (cmInstallGenerator *)0x0) ||
          (this_02 = (cmInstallCxxModuleBmiGenerator *)
                     __dynamic_cast(pcVar7,&cmInstallGenerator::typeinfo,
                                    &cmInstallCxxModuleBmiGenerator::typeinfo,0),
          this_02 == (cmInstallCxxModuleBmiGenerator *)0x0)) || (this_02->Target != gt)) {
        this_02 = pcVar29;
      }
      puVar36 = puVar36 + 1;
      pcVar29 = this_02;
    } while (puVar36 != puVar6);
    if (this_02 != (cmInstallCxxModuleBmiGenerator *)0x0) {
      Json::Value::Value((Value *)&files_per_dirs,objectValue);
      Json::Value::Value((Value *)&fill_sf_map,&this_02->FilePermissions);
      pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"permissions");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      cmInstallCxxModuleBmiGenerator::GetDestination((string *)&sf_map,this_02,config);
      Json::Value::Value((Value *)&fill_sf_map,(String *)&sf_map);
      pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"destination");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      pp_Var1 = &sf_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      uVar17 = (this_02->super_cmInstallGenerator).Message - MessageAlways;
      if (uVar17 < 3) {
        value = &DAT_008521c4 + *(int *)(&DAT_008521c4 + (ulong)uVar17 * 4);
      }
      else {
        value = "";
      }
      Json::Value::Value((Value *)&fill_sf_map,value);
      pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"message-level");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      cmInstallCxxModuleBmiGenerator::GetScriptLocation((string *)&sf_map,this_02,config);
      Json::Value::Value((Value *)&fill_sf_map,(String *)&sf_map);
      pVVar19 = Json::Value::operator[]((Value *)&files_per_dirs,"script-location");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      if ((_Base_ptr *)sf_map._M_t._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)sf_map._M_t._M_impl._0_8_,
                        (ulong)((long)&(sf_map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      goto LAB_00481b5a;
    }
  }
  Json::Value::Value((Value *)&files_per_dirs,nullValue);
LAB_00481b5a:
  pVVar19 = Json::Value::operator[](tdi,"bmi-installation");
  Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
  Json::Value::~Value((Value *)&files_per_dirs);
  Json::Value::Value((Value *)&sf_map,arrayValue);
  cmGeneratorTarget::GetExportName_abi_cxx11_((string *)&cxxModuleSources,gt);
  pcVar22 = cmGeneratorTarget::GetGlobalGenerator(gt);
  p_Var21 = (pcVar22->ExportSets).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var23 = &(pcVar22->ExportSets).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var21 != p_Var23) {
    do {
      p_Var27 = *(_Base_ptr *)(p_Var21 + 2);
      p_Var8 = p_Var21[2]._M_parent;
      uVar34 = (long)p_Var8 - (long)p_Var27;
      if (0 < (long)uVar34 >> 5) {
        p_Var26 = (_Base_ptr)((long)&p_Var27->_M_color + (uVar34 & 0xffffffffffffffe0));
        lVar32 = ((long)uVar34 >> 5) + 1;
        p_Var27 = (_Base_ptr)&p_Var27->_M_left;
        do {
          if (*(cmGeneratorTarget **)(p_Var27[-1]._M_left + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27[-1]._M_left;
            goto LAB_00481cbd;
          }
          if (*(cmGeneratorTarget **)(p_Var27[-1]._M_right + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27[-1]._M_right;
            goto LAB_00481cbd;
          }
          if (*(cmGeneratorTarget **)(*(long *)p_Var27 + 0x20) == gt) goto LAB_00481cbd;
          if (*(cmGeneratorTarget **)(p_Var27->_M_parent + 1) == gt) {
            p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
            goto LAB_00481cbd;
          }
          lVar32 = lVar32 + -1;
          p_Var27 = p_Var27 + 1;
        } while (1 < lVar32);
        uVar34 = (long)p_Var8 - (long)p_Var26;
        p_Var27 = p_Var26;
      }
      lVar32 = (long)uVar34 >> 3;
      if (lVar32 == 1) {
LAB_00481c98:
        if (*(cmGeneratorTarget **)(*(long *)p_Var27 + 0x20) != gt) {
          p_Var27 = p_Var8;
        }
LAB_00481cbd:
        if (p_Var27 != p_Var8) {
          p_Var8 = *(_Base_ptr *)(p_Var21 + 4);
          for (p_Var27 = p_Var21[3]._M_right; p_Var27 != p_Var8;
              p_Var27 = (_Base_ptr)&p_Var27->_M_parent) {
            this = *(cmInstallExportGenerator **)p_Var27;
            Json::Value::Value((Value *)&fill_sf_map,objectValue);
            fs_dest.value_.string_ = (char *)&fs_dest.comments_;
            pcVar5 = (this->CxxModulesDirectory)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&fs_dest,pcVar5,
                       pcVar5 + (this->CxxModulesDirectory)._M_string_length);
            cmInstallExportGenerator::GetTempDir_abi_cxx11_(&dest,this);
            Json::Value::Value((Value *)&files_per_dirs,&this->Namespace);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"namespace");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::Value((Value *)&files_per_dirs,(String *)&cxxModuleSources);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-name");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::Value((Value *)&files_per_dirs,
                               &(this->super_cmInstallGenerator).Destination);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"destination");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"cxx-module-info-dir");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::Value((Value *)&files_per_dirs,&dest);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-prefix");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::Value((Value *)&files_per_dirs,true);
            pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"install");
            Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
            Json::Value::~Value((Value *)&files_per_dirs);
            Json::Value::append((Value *)&sf_map,(Value *)&fill_sf_map);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dest._M_dataplus._M_p != &dest.field_2) {
              operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
            }
            if (fs_dest.value_ != &fs_dest.comments_) {
              operator_delete(fs_dest.value_.string_,
                              (long)fs_dest.comments_.ptr_._M_t.
                                    super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                                    ._M_head_impl + 1);
            }
            Json::Value::~Value((Value *)&fill_sf_map);
          }
        }
      }
      else {
        if (lVar32 == 2) {
LAB_00481c86:
          if (*(cmGeneratorTarget **)(*(long *)p_Var27 + 0x20) != gt) {
            p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
            goto LAB_00481c98;
          }
          goto LAB_00481cbd;
        }
        if (lVar32 == 3) {
          if (*(cmGeneratorTarget **)(*(long *)p_Var27 + 0x20) != gt) {
            p_Var27 = (_Base_ptr)&p_Var27->_M_parent;
            goto LAB_00481c86;
          }
          goto LAB_00481cbd;
        }
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != p_Var23);
  }
  pvVar24 = cmMakefile::GetExportBuildFileGenerators(gt->Makefile);
  puVar28 = (pvVar24->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (pvVar24->
            super__Vector_base<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar28 == puVar11) {
      if (cxxModuleSources.
          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pointer)&cxxModuleSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(cxxModuleSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)cxxModuleSources.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      pVVar19 = Json::Value::operator[](tdi,"exports");
      Json::Value::operator=(pVVar19,(Value *)&sf_map);
      Json::Value::~Value((Value *)&sf_map);
      Json::Value::Value((Value *)&fill_sf_map,config);
      pVVar19 = Json::Value::operator[](tdi,"config");
      Json::Value::operator=(pVVar19,(Value *)&fill_sf_map);
      Json::Value::~Value((Value *)&fill_sf_map);
      return;
    }
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targets.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmExportBuildFileGenerator::GetTargets
              ((puVar28->_M_t).
               super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
               .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl,&targets);
    psVar25 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    pTVar14 = targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar37 = targets.
              super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              ._M_impl.super__Vector_impl_data._M_start;
    obj_path._M_dataplus._M_p = (pointer)&obj_path.field_2;
    pcVar5 = (psVar25->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&obj_path,pcVar5,pcVar5 + psVar25->_M_string_length);
    fs_type._M_dataplus._M_p = (pointer)&fs_type.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_type,obj_path._M_dataplus._M_p,
               obj_path._M_dataplus._M_p + obj_path._M_string_length);
    dest._M_dataplus._M_p = (pointer)&dest.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&dest,fs_type._M_dataplus._M_p,
               fs_type._M_dataplus._M_p + fs_type._M_string_length);
    fs_dest.value_ = (ValueHolder)&fs_dest.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fs_dest,dest._M_dataplus._M_p,
               dest._M_dataplus._M_p + dest._M_string_length);
    ppmVar2 = &fill_sf_map.sf_map;
    fill_sf_map.gt = (cmGeneratorTarget *)ppmVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fill_sf_map,fs_dest.value_.int_,fs_dest.value_.string_ + fs_dest._8_8_);
    files_per_dirs._M_t._M_impl._0_8_ =
         &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&files_per_dirs,fill_sf_map.gt,
               (long)&(fill_sf_map.gt)->Target + (long)&(fill_sf_map.tgt)->impl);
    if (fill_sf_map.gt != (cmGeneratorTarget *)ppmVar2) {
      operator_delete(fill_sf_map.gt,(ulong)&((fill_sf_map.sf_map)->_M_t)._M_impl.field_0x1);
    }
    fill_sf_map.gt = (cmGeneratorTarget *)ppmVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fill_sf_map,files_per_dirs._M_t._M_impl._0_8_,
               CONCAT44(files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
               files_per_dirs._M_t._M_impl._0_8_);
    pcVar4 = fill_sf_map.tgt;
    pcVar9 = fill_sf_map.gt;
    uVar34 = (long)pTVar14 - (long)pTVar37;
    pTVar38 = pTVar37;
    if (0 < (long)uVar34 >> 8) {
      pTVar38 = (pointer)((long)&(pTVar37->Name)._M_dataplus._M_p + (uVar34 & 0xffffffffffffff00));
      lVar32 = ((long)uVar34 >> 8) + 1;
      pTVar30 = pTVar37 + 2;
      do {
        if ((cmTarget *)pTVar30[-2].Name._M_string_length == pcVar4) {
          if (pcVar4 == (cmTarget *)0x0) {
            pTVar39 = pTVar30 + -2;
            goto LAB_00482244;
          }
          iVar16 = bcmp(pTVar30[-2].Name._M_dataplus._M_p,pcVar9,(size_t)pcVar4);
          pTVar39 = pTVar37;
          if (iVar16 == 0) goto LAB_00482244;
          if ((cmTarget *)pTVar30[-1].Name._M_string_length == pcVar4) {
            pTVar39 = pTVar30 + -1;
            goto LAB_004820f9;
          }
        }
        else if ((cmTarget *)pTVar30[-1].Name._M_string_length == pcVar4) {
          if (pcVar4 == (cmTarget *)0x0) {
            pTVar39 = pTVar30 + -1;
            goto LAB_00482244;
          }
          pTVar39 = pTVar37 + 1;
LAB_004820f9:
          iVar16 = bcmp((pTVar39->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4);
          if (iVar16 == 0) goto LAB_00482244;
        }
        if ((cmTarget *)(pTVar30->Name)._M_string_length == pcVar4) {
          pTVar39 = pTVar30;
          if ((pcVar4 == (cmTarget *)0x0) ||
             (iVar16 = bcmp((pTVar30->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4), iVar16 == 0))
          goto LAB_00482244;
          if ((cmTarget *)pTVar30[1].Name._M_string_length == pcVar4) {
            pTVar39 = pTVar30 + 1;
            goto LAB_00482158;
          }
        }
        else if ((cmTarget *)pTVar30[1].Name._M_string_length == pcVar4) {
          if (pcVar4 == (cmTarget *)0x0) {
            pTVar39 = pTVar30 + 1;
            goto LAB_00482244;
          }
          pTVar39 = pTVar37 + 3;
LAB_00482158:
          iVar16 = bcmp((pTVar39->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4);
          if (iVar16 == 0) goto LAB_00482244;
        }
        pTVar37 = pTVar37 + 4;
        lVar32 = lVar32 + -1;
        pTVar30 = pTVar30 + 4;
      } while (1 < lVar32);
      uVar34 = (long)pTVar14 - (long)pTVar38;
    }
    lVar32 = (long)uVar34 >> 6;
    if (lVar32 == 1) {
LAB_004821f9:
      pTVar39 = pTVar14;
      if ((((cmTarget *)(pTVar38->Name)._M_string_length == pcVar4) &&
          (pTVar39 = pTVar38, pcVar4 != (cmTarget *)0x0)) &&
         (iVar16 = bcmp((pTVar38->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4), iVar16 != 0)) {
        pTVar39 = pTVar14;
      }
    }
    else if (lVar32 == 2) {
LAB_004821d6:
      if (((cmTarget *)(pTVar38->Name)._M_string_length != pcVar4) ||
         ((pTVar39 = pTVar38, pcVar4 != (cmTarget *)0x0 &&
          (iVar16 = bcmp((pTVar38->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4), iVar16 != 0)))) {
        pTVar38 = pTVar38 + 1;
        goto LAB_004821f9;
      }
    }
    else {
      pTVar39 = pTVar14;
      if ((lVar32 == 3) &&
         (((cmTarget *)(pTVar38->Name)._M_string_length != pcVar4 ||
          ((pTVar39 = pTVar38, pcVar4 != (cmTarget *)0x0 &&
           (iVar16 = bcmp((pTVar38->Name)._M_dataplus._M_p,pcVar9,(size_t)pcVar4), iVar16 != 0))))))
      {
        pTVar38 = pTVar38 + 1;
        goto LAB_004821d6;
      }
    }
LAB_00482244:
    if (pcVar9 != (cmGeneratorTarget *)&fill_sf_map.sf_map) {
      operator_delete(pcVar9,(ulong)&((fill_sf_map.sf_map)->_M_t)._M_impl.field_0x1);
    }
    pCVar3 = &fs_dest.comments_;
    if ((_Base_ptr *)files_per_dirs._M_t._M_impl._0_8_ !=
        &files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)files_per_dirs._M_t._M_impl._0_8_,
                      (ulong)((long)&(files_per_dirs._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (fs_dest.value_ != pCVar3) {
      operator_delete(fs_dest.value_.string_,
                      (long)fs_dest.comments_.ptr_._M_t.
                            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                            .
                            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dest._M_dataplus._M_p != &dest.field_2) {
      operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
      operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_path._M_dataplus._M_p != &obj_path.field_2) {
      operator_delete(obj_path._M_dataplus._M_p,obj_path.field_2._M_allocated_capacity + 1);
    }
    if (pTVar39 != pTVar14) {
      Json::Value::Value((Value *)&fill_sf_map,objectValue);
      pcVar12 = (puVar28->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      _Var33._M_p = (pcVar12->super_cmExportFileGenerator).Namespace._M_dataplus._M_p;
      fs_dest.value_ = (ValueHolder)pCVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fs_dest,_Var33._M_p,
                 _Var33._M_p +
                 *(size_type *)((long)&(pcVar12->super_cmExportFileGenerator).Namespace + 8));
      psVar25 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar28->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      pcVar12 = (puVar28->_M_t).
                super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>._M_head_impl;
      cmsys::SystemTools::GetParentDirectory(&dest,psVar25);
      psVar25 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                          (&((puVar28->_M_t).
                             super___uniq_ptr_impl<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmExportBuildFileGenerator_*,_std::default_delete<cmExportBuildFileGenerator>_>
                             .super__Head_base<0UL,_cmExportBuildFileGenerator_*,_false>.
                            _M_head_impl)->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&fs_type,psVar25);
      Json::Value::Value((Value *)&files_per_dirs,(String *)&fs_dest);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"namespace");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,(String *)&cxxModuleSources);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-name");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&dest);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"destination");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&pcVar12->CxxModulesDirectory);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"cxx-module-info-dir");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,&fs_type);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"export-prefix");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::Value((Value *)&files_per_dirs,false);
      pVVar19 = Json::Value::operator[]((Value *)&fill_sf_map,"install");
      Json::Value::operator=(pVVar19,(Value *)&files_per_dirs);
      Json::Value::~Value((Value *)&files_per_dirs);
      Json::Value::append((Value *)&sf_map,(Value *)&fill_sf_map);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fs_type._M_dataplus._M_p != &fs_type.field_2) {
        operator_delete(fs_type._M_dataplus._M_p,fs_type.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dest._M_dataplus._M_p != &dest.field_2) {
        operator_delete(dest._M_dataplus._M_p,dest.field_2._M_allocated_capacity + 1);
      }
      if (fs_dest.value_ != pCVar3) {
        operator_delete(fs_dest.value_.string_,
                        (long)fs_dest.comments_.ptr_._M_t.
                              super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                              .
                              super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
                              ._M_head_impl + 1);
      }
      Json::Value::~Value((Value *)&fill_sf_map);
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector(&targets);
    puVar28 = puVar28 + 1;
  } while( true );
}

Assistant:

void cmDyndepCollation::AddCollationInformation(
  Json::Value& tdi, cmGeneratorTarget const* gt, std::string const& config,
  cmDyndepGeneratorCallbacks const& cb)
{
  tdi["cxx-modules"] = CollationInformationCxxModules(gt, config, cb);
  tdi["bmi-installation"] = CollationInformationBmiInstallation(gt, config);
  tdi["exports"] = CollationInformationExports(gt);
  tdi["config"] = config;
}